

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O2

bool __thiscall cmCustomCommandGenerator::HasOnlyEmptyCommandLines(cmCustomCommandGenerator *this)

{
  pointer pcVar1;
  long lVar2;
  ulong uVar3;
  size_t i;
  ulong uVar4;
  long lVar5;
  long *plVar6;
  
  pcVar1 = (this->CommandLines).
           super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
           super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = ((long)(this->CommandLines).
                 super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                 super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)pcVar1) / 0x18;
  for (uVar4 = 0; uVar4 != uVar3; uVar4 = uVar4 + 1) {
    lVar2 = *(long *)&pcVar1[uVar4].
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    lVar5 = ((long)*(pointer *)
                    ((long)&pcVar1[uVar4].
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    + 8) - lVar2 >> 5) + 1;
    plVar6 = (long *)(lVar2 + 8);
    while (lVar5 = lVar5 + -1, lVar5 != 0) {
      lVar2 = *plVar6;
      plVar6 = plVar6 + 4;
      if (lVar2 != 0) goto LAB_002b4fb1;
    }
  }
LAB_002b4fb1:
  return uVar3 <= uVar4;
}

Assistant:

bool cmCustomCommandGenerator::HasOnlyEmptyCommandLines() const
{
  for (size_t i = 0; i < this->CommandLines.size(); ++i) {
    for (size_t j = 0; j < this->CommandLines[i].size(); ++j) {
      if (!this->CommandLines[i][j].empty()) {
        return false;
      }
    }
  }
  return true;
}